

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::CollationSettings::setStrength
          (CollationSettings *this,int32_t value,int32_t defaultOptions,UErrorCode *errorCode)

{
  uint uVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (3 < (uint)value) {
    if (value == -1) {
      uVar1 = defaultOptions & 0xf000;
      goto LAB_002370c6;
    }
    if (value != 0xf) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
  }
  uVar1 = value << 0xc;
LAB_002370c6:
  this->options = this->options & 0xffff0fffU | uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }